

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

bool pbrt::ParseArg<bool*>
               (char ***argv,string *name,bool *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  string value;
  string arg;
  __string_type __str;
  string local_d0;
  string local_b0;
  anon_unknown_56 *local_90;
  string *local_88;
  long local_80 [2];
  anon_unknown_56 *local_70;
  string *local_68;
  long local_60 [2];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,**argv,(allocator<char> *)&local_d0);
  if (local_90[1] == (anon_unknown_56)0x2d) {
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_90);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_90);
  }
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_56::normalizeArg(&local_d0,local_90,local_88);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_70 = (anon_unknown_56 *)local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_70,(ulong)local_68,0,'\x01');
  anon_unknown_56::normalizeArg(&local_b0,local_70,local_68);
  if (local_d0._M_string_length < local_b0._M_string_length) {
    bVar6 = false;
  }
  else if ((string *)local_b0._M_string_length == (string *)0x0) {
    bVar6 = true;
  }
  else {
    puVar4 = (undefined1 *)0x0;
    do {
      bVar6 = local_b0._M_dataplus._M_p[(long)puVar4] == local_d0._M_dataplus._M_p[(long)puVar4];
      if (!bVar6) break;
      bVar5 = (undefined1 *)((long)&((string *)(local_b0._M_string_length + -0x20))->field_2 + 0xf)
              != puVar4;
      puVar4 = puVar4 + 1;
    } while (bVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != (anon_unknown_56 *)local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    anon_unknown_56::normalizeArg(&local_d0,local_90,local_88);
    anon_unknown_56::normalizeArg
              (&local_b0,(anon_unknown_56 *)(name->_M_dataplus)._M_p,
               (string *)name->_M_string_length);
    if (local_d0._M_string_length == local_b0._M_string_length) {
      if ((string *)local_d0._M_string_length == (string *)0x0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp(local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d0._M_string_length);
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      *argv = *argv + 1;
      bVar6 = true;
      *out = true;
    }
    else {
      bVar6 = false;
    }
    goto LAB_001d350f;
  }
  *argv = *argv + 1;
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_90);
  anon_unknown_56::normalizeArg
            (&local_d0,(anon_unknown_56 *)local_b0._M_dataplus._M_p,
             (string *)local_b0._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 == 0) {
    bVar5 = false;
LAB_001d34a2:
    bVar6 = true;
    *out = bVar5;
  }
  else {
    anon_unknown_56::normalizeArg
              (&local_d0,(anon_unknown_56 *)local_b0._M_dataplus._M_p,
               (string *)local_b0._M_string_length);
    iVar3 = std::__cxx11::string::compare((char *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      bVar5 = true;
      goto LAB_001d34a2;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
              (&local_50,"invalid value \"%s\" for %s argument",&local_b0,name);
    if ((onError->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*onError->_M_invoker)((_Any_data *)onError,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_001d350f:
  if (local_90 != (anon_unknown_56 *)local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return bVar6;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}